

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbifnet.cpp
# Opt level: O0

void __thiscall
TadsHttpReqResult::TadsHttpReqResult
          (TadsHttpReqResult *this,vm_globalvar_t *idg,int status,CVmDataSource *reply,char *hdrs,
          char *loc)

{
  long in_RCX;
  uint in_EDX;
  undefined8 in_RSI;
  OS_Event *in_RDI;
  undefined8 in_R8;
  TadsEventMessage *in_R9;
  
  TadsEventMessage::TadsEventMessage(in_R9,in_RDI);
  (in_RDI->super_CVmRefCntObj)._vptr_CVmRefCntObj = (_func_int **)&PTR__TadsHttpReqResult_0042b8e0;
  *(undefined8 *)((long)&in_RDI->cond + 0x18) = 0;
  *(undefined8 *)((long)&in_RDI->cond + 0x20) = in_RSI;
  (in_RDI->cond).__data.__g_signals[0] = in_EDX;
  (in_RDI->mutex).__align = in_RCX;
  *(undefined8 *)((long)&in_RDI->mutex + 8) = in_R8;
  *(TadsEventMessage **)((long)&in_RDI->mutex + 0x10) = in_R9;
  return;
}

Assistant:

TadsHttpReqResult(VMG_  vm_globalvar_t *idg, int status,
                      CVmDataSource *reply, char *hdrs, char *loc)
        : TadsEventMessage(0)
    {
        /* save the VM globals */
        vmg = VMGLOB_ADDR;

        /* save the ID global */
        this->idg = idg;

        /* remember the status */
        this->status = status;

        /* take ownership of the reply, headers, and location objects */
        this->reply = reply;
        this->hdrs = hdrs;
        this->loc = loc;
    }